

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestGroupStats::TestGroupStats(TestGroupStats *this,TestGroupStats *param_1)

{
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_00571e80;
  GroupInfo::GroupInfo(&this->groupInfo,&param_1->groupInfo);
  Totals::Totals(&this->totals,&param_1->totals);
  this->aborting = param_1->aborting;
  return;
}

Assistant:

TestGroupStats( TestGroupStats const& )              = default;